

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O2

aom_codec_err_t aom_codec_get_stream_info(aom_codec_ctx_t *ctx,aom_codec_stream_info_t *si)

{
  aom_codec_iface_t *paVar1;
  aom_codec_alg_priv_t_conflict *paVar2;
  aom_codec_err_t aVar3;
  
  if (si == (aom_codec_stream_info_t *)0x0 || ctx == (aom_codec_ctx_t *)0x0) {
    aVar3 = AOM_CODEC_INVALID_PARAM;
    if (ctx == (aom_codec_ctx_t *)0x0) {
      return AOM_CODEC_INVALID_PARAM;
    }
  }
  else {
    paVar1 = ctx->iface;
    aVar3 = AOM_CODEC_ERROR;
    if ((paVar1 != (aom_codec_iface_t *)0x0) &&
       (paVar2 = (aom_codec_alg_priv_t_conflict *)ctx->priv,
       paVar2 != (aom_codec_alg_priv_t_conflict *)0x0)) {
      si->w = 0;
      si->h = 0;
      aVar3 = (*(paVar1->dec).get_si)(paVar2,si);
    }
  }
  ctx->err = aVar3;
  return aVar3;
}

Assistant:

aom_codec_err_t aom_codec_get_stream_info(aom_codec_ctx_t *ctx,
                                          aom_codec_stream_info_t *si) {
  aom_codec_err_t res;

  if (!ctx || !si) {
    res = AOM_CODEC_INVALID_PARAM;
  } else if (!ctx->iface || !ctx->priv) {
    res = AOM_CODEC_ERROR;
  } else {
    /* Set default/unknown values */
    si->w = 0;
    si->h = 0;

    res = ctx->iface->dec.get_si(get_alg_priv(ctx), si);
  }

  return SAVE_STATUS(ctx, res);
}